

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::receive(WebSocketImpl *this,size_t maxSize)

{
  byte *__src;
  PromiseArena *pPVar1;
  undefined8 *puVar2;
  _func_int ***ppp_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  OwnPromiseNode node;
  byte bVar6;
  Array<unsigned_char> *__begin4;
  ulong uVar7;
  void *pvVar8;
  PromiseArenaMember *pPVar9;
  byte bVar10;
  long lVar11;
  char *pcVar12;
  uchar *puVar13;
  ulong uVar14;
  PromiseArenaMember *in_RDX;
  undefined8 unaff_RBP;
  Array<unsigned_char> *fragment_1;
  undefined8 *puVar15;
  uint16_t code;
  unsigned_long *in_R9;
  PromiseArenaMember *pPVar16;
  Context *__dest;
  undefined8 unaff_R13;
  long lVar17;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 this_00;
  WebSocketErrorHandler *pWVar18;
  StringPtr reason;
  StringPtr reason_00;
  StringPtr reason_01;
  Array<unsigned_char> message;
  size_t payloadLen;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2937:17),_unsigned_long>
  promise;
  Vector<kj::Array<unsigned_char>_> *__range4;
  anon_class_96_10_18673444_for_func handleMessage;
  undefined1 local_228 [48];
  undefined1 local_1f8 [32];
  OwnPromiseNode local_1d8;
  WebSocketErrorHandler *local_1d0;
  undefined1 local_1c8 [408];
  
  if (*(char *)(maxSize + 0x178) == '\x01') {
    Exception::Exception((Exception *)local_1c8,(Exception *)(maxSize + 0x180));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)local_228,(Exception *)local_1c8);
    uVar4 = local_228._0_8_;
    local_228._0_8_ = (_func_int **)0x0;
    (this->super_WebSocket)._vptr_WebSocket = (_func_int **)uVar4;
    Exception::~Exception((Exception *)local_1c8);
    return (PromiseBase)(PromiseBase)this;
  }
  __src = *(byte **)(maxSize + 0x398);
  uVar14 = *(ulong *)(maxSize + 0x3a0);
  uVar7 = 2;
  if (1 < uVar14) {
    lVar11 = (ulong)(__src[1] >> 7) * 4;
    uVar7 = lVar11 + 2;
    bVar10 = __src[1] & 0x7f;
    if (bVar10 == 0x7e) {
      uVar7 = lVar11 + 4;
    }
    else if (bVar10 == 0x7f) {
      uVar7 = uVar7 | 8;
    }
  }
  lVar11 = uVar14 - uVar7;
  local_228._40_8_ = in_RDX;
  if (uVar14 < uVar7) {
    if (__src != *(byte **)(maxSize + 0x380)) {
      if (uVar14 != 0) {
        memmove(*(byte **)(maxSize + 0x380),__src,uVar14);
      }
      *(undefined8 *)(maxSize + 0x398) = *(undefined8 *)(maxSize + 0x380);
    }
    lVar11 = *(long *)(maxSize + 0x398) + *(long *)(maxSize + 0x3a0);
    (**(code **)(**(long **)(maxSize + 0x18) + 8))
              (local_228 + 0x18,*(long **)(maxSize + 0x18),lVar11,1,
               (*(long *)(maxSize + 0x380) + *(long *)(maxSize + 0x388)) - lVar11);
    uVar4 = local_228._24_8_;
    pPVar1 = *(PromiseArena **)(local_228._24_8_ + 8);
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_228._24_8_ - (long)pPVar1) < 0x30) {
      pvVar8 = operator_new(0x400);
      this_00.value = (long)pvVar8 + 0x3d0;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)(local_228 + 0x18),
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2708:17)>
                 ::anon_class_16_2_007aca32_for_func::operator());
      *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_00702ce0;
      *(size_t *)((long)pvVar8 + 0x3f0) = maxSize;
      *(undefined8 *)((long)pvVar8 + 0x3f8) = local_228._40_8_;
      *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
    }
    else {
      *(PromiseArena **)(local_228._24_8_ + 8) = (PromiseArena *)0x0;
      this_00.value = local_228._24_8_ + -0x30;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)(local_228 + 0x18),
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2708:17)>
                 ::anon_class_16_2_007aca32_for_func::operator());
      ((PromiseArenaMember *)(uVar4 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_00702ce0;
      ((PromiseArenaMember *)(uVar4 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)maxSize;
      ((PromiseArenaMember *)(uVar4 + -0x10))->arena = (PromiseArena *)local_228._40_8_;
      ((PromiseArenaMember *)(uVar4 + -0x30))->arena = pPVar1;
    }
    local_1c8._0_8_ = &DAT_005053bd;
    local_1c8._8_8_ = &DAT_0050541c;
    local_1c8._16_8_ = (ArrayDisposer *)0x4c0000058b;
    local_1d8.ptr = (PromiseNode *)this_00;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)local_228,&local_1d8,(SourceLocation *)local_1c8);
    node.ptr = local_1d8.ptr;
    (this->super_WebSocket)._vptr_WebSocket = (_func_int **)local_228._0_8_;
    if (local_1d8.ptr != (PromiseNode *)0x0) {
      local_1d8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    uVar4 = local_228._24_8_;
    if ((PromiseArenaMember *)local_228._24_8_ == (PromiseArenaMember *)0x0) {
      return (PromiseBase)(PromiseBase)this;
    }
    local_228._24_8_ = (AsyncIoStream *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
    return (PromiseBase)(PromiseBase)this;
  }
  code = (uint16_t)maxSize;
  if ((*__src & 0x30) != 0) {
    pcVar12 = "Received frame had RSV bits 2 or 3 set";
LAB_00415672:
    reason.content.size_ = (size_t)pcVar12;
    reason.content.ptr = (char *)0x3ea;
    sendCloseDueToError(this,code,reason);
    return (PromiseBase)(PromiseBase)this;
  }
  *(byte **)(maxSize + 0x398) = __src + uVar7;
  *(long *)(maxSize + 0x3a0) = lVar11;
  pPVar16 = (PromiseArenaMember *)(ulong)(__src[1] & 0x7f);
  if (pPVar16 == (PromiseArenaMember *)0x7e) {
    pPVar16 = (PromiseArenaMember *)
              (ulong)(ushort)(*(ushort *)(__src + 2) << 8 | *(ushort *)(__src + 2) >> 8);
  }
  else if ((__src[1] & 0x7f) == 0x7f) {
    uVar7 = *(ulong *)(__src + 2);
    pPVar16 = (PromiseArenaMember *)
              (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
               | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 |
               (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
  }
  local_228._24_8_ = pPVar16;
  if (in_RDX < pPVar16) {
    str<char_const(&)[23],unsigned_long&,char_const(&)[4],unsigned_long&>
              ((String *)local_1c8,(kj *)"Message is too large: ",(char (*) [23])(local_228 + 0x18),
               (unsigned_long *)" > ",(char (*) [4])(local_228 + 0x28),in_R9);
    puVar13 = (uchar *)local_1c8._0_8_;
    if ((char *)local_1c8._8_8_ == (char *)0x0) {
      puVar13 = "";
    }
    reason_00.content.size_ = (size_t)puVar13;
    reason_00.content.ptr = (char *)0x3f1;
    sendCloseDueToError((WebSocketImpl *)local_228,code,reason_00);
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    attach<kj::String>((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                        *)this,(String *)local_228);
    uVar4 = local_228._0_8_;
    if ((PromiseArenaMember *)local_228._0_8_ != (PromiseArenaMember *)0x0) {
      local_228._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
    }
    uVar5 = local_1c8._8_8_;
    uVar4 = local_1c8._0_8_;
    if ((uchar *)local_1c8._0_8_ == (uchar *)0x0) {
      return (PromiseBase)(PromiseBase)this;
    }
    local_1c8._0_8_ = (uchar *)0x0;
    local_1c8._8_8_ = (char *)0x0;
    (***(_func_int ***)local_1c8._16_8_)(local_1c8._16_8_,uVar4,1,uVar5,uVar5,0);
    return (PromiseBase)(PromiseBase)this;
  }
  bVar10 = *__src;
  uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar10);
  pPVar9 = (PromiseArenaMember *)(uVar7 & 0xffffff0f);
  bVar6 = (byte)pPVar9;
  if ((bVar10 & 0xf) == 0) {
    lVar11 = *(long *)(maxSize + 0x368);
    if (lVar11 == *(long *)(maxSize + 0x360)) {
      pcVar12 = "Unexpected continuation frame";
      goto LAB_00415672;
    }
    pPVar9 = (PromiseArenaMember *)
             CONCAT71((int7)((ulong)unaff_R13 >> 8),*(undefined1 *)(maxSize + 0x358));
  }
  else if (((bVar10 & 0xf) < 7 || bVar6 == 7) &&
          (lVar11 = *(long *)(maxSize + 0x368), lVar11 != *(long *)(maxSize + 0x360))) {
    pcVar12 = "Missing continuation frame";
    goto LAB_00415672;
  }
  local_228._0_8_ = (_func_int **)0x0;
  local_228._8_8_ = (_func_int **)0x0;
  local_228._16_8_ = (ArrayDisposer *)0x0;
  if ((char)bVar10 < '\0') {
    local_228._36_4_ = (undefined4)CONCAT71((int7)((ulong)lVar11 >> 8),1);
    uVar14 = 4;
    if (((*__src & 0x40) == 0) && (*(char *)(maxSize + 0x35c) == '\0')) {
      uVar14 = (ulong)((char)pPVar9 == '\x01');
      local_228._36_4_ = 0;
    }
    pPVar16 = (PromiseArenaMember *)((long)&pPVar16->_vptr_PromiseArenaMember + uVar14);
    if (bVar6 < 8) {
      lVar11 = *(long *)(maxSize + 0x360);
      if (*(long *)(maxSize + 0x368) != lVar11) {
        local_1f8._24_8_ = maxSize + 0x360;
        lVar17 = 0;
        do {
          lVar17 = lVar17 + *(long *)(lVar11 + 8);
          lVar11 = lVar11 + 0x18;
        } while (lVar11 != *(long *)(maxSize + 0x368));
        pPVar16 = (PromiseArenaMember *)((long)&pPVar16->_vptr_PromiseArenaMember + lVar17);
        local_1c8._0_8_ =
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,(size_t)pPVar16,(size_t)pPVar16,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
        uVar5 = local_228._8_8_;
        uVar4 = local_228._0_8_;
        local_1c8._16_8_ = &kj::_::HeapArrayDisposer::instance;
        local_1f8._16_8_ = this;
        local_1c8._8_8_ = pPVar16;
        if ((_func_int **)local_228._0_8_ != (_func_int **)0x0) {
          local_228._0_8_ = (_func_int **)0x0;
          local_228._8_8_ = (_func_int **)0x0;
          (***(_func_int ***)local_228._16_8_)(local_228._16_8_,uVar4,1,uVar5,uVar5,0);
        }
        local_228._0_8_ = local_1c8._0_8_;
        local_228._8_8_ = local_1c8._8_8_;
        local_228._16_8_ = local_1c8._16_8_;
        local_1c8._0_8_ = (uchar *)0x0;
        local_1c8._8_8_ = (char *)0x0;
        Array<unsigned_char>::~Array((Array<unsigned_char> *)local_1c8);
        ppp_Var3 = (_func_int ***)local_228._40_8_;
        puVar2 = *(undefined8 **)(maxSize + 0x368);
        lVar11 = 0;
        for (puVar15 = *(undefined8 **)(maxSize + 0x360); puVar15 != puVar2; puVar15 = puVar15 + 3)
        {
          memcpy((char *)(local_228._0_8_ + lVar11),(void *)*puVar15,puVar15[1]);
          lVar11 = lVar11 + puVar15[1];
        }
        __dest = (Context *)(lVar11 + local_228._0_8_);
        ArrayBuilder<kj::Array<unsigned_char>_>::clear
                  ((ArrayBuilder<kj::Array<unsigned_char>_> *)local_1f8._24_8_);
        *(undefined4 *)(maxSize + 0x358) = 0;
        *(undefined1 *)(maxSize + 0x35c) = 0;
        local_1c8[0x30] = '\x01';
        uVar7 = (ulong)bVar10;
        this = (WebSocketImpl *)local_1f8._16_8_;
        pPVar16 = (PromiseArenaMember *)((long)ppp_Var3 + lVar17);
        goto LAB_00415ba9;
      }
    }
    local_1c8._0_8_ =
         kj::_::HeapArrayDisposer::allocateImpl
                   (1,(size_t)pPVar16,(size_t)pPVar16,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    uVar5 = local_228._8_8_;
    uVar4 = local_228._0_8_;
    local_1c8._16_8_ = &kj::_::HeapArrayDisposer::instance;
    local_1c8._8_8_ = pPVar16;
    if ((_func_int **)local_228._0_8_ != (_func_int **)0x0) {
      local_228._0_8_ = (_func_int **)0x0;
      local_228._8_8_ = (_func_int **)0x0;
      (***(_func_int ***)local_228._16_8_)(local_228._16_8_,uVar4,1,uVar5,uVar5,0);
    }
    local_228._0_8_ = local_1c8._0_8_;
    local_228._8_8_ = local_1c8._8_8_;
    local_228._16_8_ = local_1c8._16_8_;
    local_1c8._0_8_ = (uchar *)0x0;
    local_1c8._8_8_ = (char *)0x0;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_1c8);
    local_1c8[0x30] = '\x01';
    __dest = (Context *)local_228._0_8_;
    pPVar16 = (PromiseArenaMember *)local_228._40_8_;
  }
  else {
    if (7 < bVar6) {
      reason_01.content.size_ = (size_t)"Received fragmented control frame";
      reason_01.content.ptr = (char *)0x3ea;
      sendCloseDueToError(this,code,reason_01);
      goto LAB_00415d6d;
    }
    local_1c8._0_8_ =
         kj::_::HeapArrayDisposer::allocateImpl
                   (1,(size_t)pPVar16,(size_t)pPVar16,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    uVar5 = local_228._8_8_;
    uVar4 = local_228._0_8_;
    local_1c8._16_8_ = &kj::_::HeapArrayDisposer::instance;
    local_1c8._8_8_ = pPVar16;
    if ((_func_int **)local_228._0_8_ != (_func_int **)0x0) {
      local_228._0_8_ = (_func_int **)0x0;
      local_228._8_8_ = (_func_int **)0x0;
      (***(_func_int ***)local_228._16_8_)(local_228._16_8_,uVar4,1,uVar5,uVar5,0);
    }
    local_228._0_8_ = local_1c8._0_8_;
    local_228._8_8_ = local_1c8._8_8_;
    local_228._16_8_ = local_1c8._16_8_;
    local_1c8._0_8_ = (uchar *)0x0;
    local_1c8._8_8_ = (char *)0x0;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_1c8);
    if (*(long *)(maxSize + 0x368) == *(long *)(maxSize + 0x360)) {
      *(uint *)(maxSize + 0x358) = (uint)pPVar9 & 0xff;
      *(byte *)(maxSize + 0x35c) = *__src >> 6 & 1;
    }
    local_1c8[0x30] = '\0';
    local_228._36_4_ = 0;
    __dest = (Context *)local_228._0_8_;
    pPVar16 = pPVar9;
  }
LAB_00415ba9:
  local_1c8[0x24] = (char)(uVar7 >> 7) & OVERLOADED;
  local_1c8._32_4_ = 0;
  if ((char)__src[1] < '\0') {
    bVar10 = __src[1] & 0x7f;
    lVar11 = 10;
    if (bVar10 != 0x7f) {
      lVar11 = (ulong)(bVar10 == 0x7e) * 2 + 2;
    }
    local_1c8._32_4_ = *(undefined4 *)(__src + lVar11);
  }
  local_1c8[8] = (char)pPVar9;
  local_1c8._24_8_ = local_228._24_8_;
  local_1c8._40_8_ = local_228._40_8_;
  if (local_1c8[0x30] != '\0') {
    local_1c8._56_8_ = pPVar16;
  }
  local_1c8[0x40] = (undefined1)local_228._36_4_;
  local_1c8._72_8_ = local_228._0_8_;
  local_1c8._80_8_ = local_228._8_8_;
  local_1c8._88_8_ = local_228._16_8_;
  local_228._0_8_ = (_func_int **)0x0;
  local_228._8_8_ = (_func_int **)0x0;
  local_1c8._0_8_ = maxSize;
  local_1c8._16_8_ = __dest;
  if (*(PromiseArenaMember **)(maxSize + 0x3a0) < (ulong)local_228._24_8_) {
    memcpy(__dest,*(void **)(maxSize + 0x398),(size_t)*(PromiseArenaMember **)(maxSize + 0x3a0));
    pWVar18 = (WebSocketErrorHandler *)(local_228._24_8_ - *(long *)(maxSize + 0x3a0));
    (**(code **)(**(long **)(maxSize + 0x18) + 8))
              (local_1f8 + 8,*(long **)(maxSize + 0x18),
               (char *)((long)&__dest->file + *(long *)(maxSize + 0x3a0)),pWVar18,pWVar18);
    local_1d8.ptr = (PromiseNode *)maxSize;
    local_1d0 = pWVar18;
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_2_>
              ((Promise<unsigned_long> *)local_1f8,
               (anon_class_16_2_99444263_for_func *)(local_1f8 + 8));
    uVar4 = local_1f8._8_8_;
    if ((PromiseArenaMember *)local_1f8._8_8_ != (PromiseArenaMember *)0x0) {
      local_1f8._8_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
    }
    *(undefined8 *)(maxSize + 0x398) = 0;
    *(undefined8 *)(maxSize + 0x3a0) = 0;
    Promise<void>::
    then<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(anon_class_96_10_18673444_for_func *)local_1f8);
    uVar4 = local_1f8._0_8_;
    if ((PromiseArenaMember *)local_1f8._0_8_ != (PromiseArenaMember *)0x0) {
      local_1f8._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
    }
  }
  else {
    memcpy(__dest,*(void **)(maxSize + 0x398),local_228._24_8_);
    *(long *)(maxSize + 0x398) =
         (long)((long)(_func_int ***)local_228._24_8_ + *(long *)(maxSize + 0x398));
    *(long *)(maxSize + 0x3a0) = *(long *)(maxSize + 0x3a0) - local_228._24_8_;
    kj::_::
    SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2811:9)>
    ::anon_class_96_10_18673444_for_func::operator()((anon_class_96_10_18673444_for_func *)this);
  }
  uVar5 = local_1c8._80_8_;
  uVar4 = local_1c8._72_8_;
  if ((Context *)local_1c8._72_8_ != (Context *)0x0) {
    local_1c8._72_8_ = (Context *)0x0;
    local_1c8._80_8_ = (PromiseArenaMember *)0x0;
    (***(_func_int ***)local_1c8._88_8_)(local_1c8._88_8_,uVar4,1,uVar5,uVar5,0);
  }
LAB_00415d6d:
  uVar5 = local_228._8_8_;
  uVar4 = local_228._0_8_;
  if ((_func_int **)local_228._0_8_ == (_func_int **)0x0) {
    return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
           (unsigned_long)this;
  }
  local_228._0_8_ = (_func_int **)0x0;
  local_228._8_8_ = (_func_int **)0x0;
  (***(_func_int ***)local_228._16_8_)(local_228._16_8_,uVar4,1,uVar5,uVar5,0);
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         (unsigned_long)this;
}

Assistant:

kj::Promise<Message> receive(size_t maxSize) override {
    KJ_IF_SOME(ex, receiveException) {
      return kj::cp(ex);
    }

    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.first(recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this,maxSize](size_t actual) -> kj::Promise<Message> {
        receivedBytes += actual;
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.first(recvData.size() + actual);
        return receive(maxSize);
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());
    if (recvHeader.hasRsv2or3()) {
      return sendCloseDueToError(1002, "Received frame had RSV bits 2 or 3 set");
    }

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();
    if (payloadLen > maxSize) {
      auto description = kj::str("Message is too large: ", payloadLen, " > ", maxSize);
      return sendCloseDueToError(1009, description.asPtr()).attach(kj::mv(description));
    }

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      if (fragments.empty()) {
        return sendCloseDueToError(1002, "Unexpected continuation frame");
      }

      opcode = fragmentOpcode;
    } else if (isData) {
      if (!fragments.empty()) {
        return sendCloseDueToError(1002, "Missing continuation frame");
      }
    }

    bool isFin = recvHeader.isFin();
    bool isCompressed = false;

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    kj::Maybe<size_t> originalMaxSize; // maxSize from first `receive()` call
    if (isFin) {
      size_t amountToAllocate;
      if (recvHeader.isCompressed() || fragmentCompressed) {
        // Add 4 since we append 0x00 0x00 0xFF 0xFF to the tail of the payload.
        // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
        amountToAllocate = payloadLen + 4;
        isCompressed = true;
      } else {
        // Add space for NUL terminator when allocating text message.
        amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);
      }

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);
        originalMaxSize = offset + maxSize; // gives us back the original maximum message size.

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
        fragmentCompressed = false;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        originalMaxSize = maxSize; // gives us back the original maximum message size.
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      if (!isData) {
        return sendCloseDueToError(1002, "Received fragmented control frame");
      }

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
        fragmentCompressed = recvHeader.isCompressed();
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage =
        [this,opcode,payloadTarget,payloadLen,mask,isFin,maxSize,originalMaxSize,
         isCompressed,message=kj::mv(message)]() mutable
        -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        auto newMax = maxSize - message.size();
        fragments.add(kj::mv(message));
        return receive(newMax);
      }

      // Provide a reasonable error if a compressed frame is received without compression enabled.
      if (isCompressed && compressionConfig == kj::none) {
        return sendCloseDueToError(
            1002,
            "Received a WebSocket frame whose compression bit was set, but the compression "
            "extension was not negotiated for this connection.");
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            bool addNullTerminator = true;
            // We want to add the null terminator when receiving a TEXT message.
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize,
                addNullTerminator);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(kj::String(decompressed.releaseAsChars()));
              }
            }
          }
#endif // KJ_HAS_ZLIB
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(decompressed.releaseAsBytes());
              }
            }
          }
#endif // KJ_HAS_ZLIB
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive(maxSize);
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive(maxSize);
        default:
          {
            auto description = kj::str("Unknown opcode ", opcode);
            return sendCloseDueToError(1002, description.asPtr()).attach(kj::mv(description));
          }
      }
    };

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([this, remaining](size_t amount) {
        receivedBytes += amount;
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }